

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int attrset_add_attr(BigAttrSet *attrset,char *attrname,char *dtype,int nmemb)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  BigAttr *pBVar5;
  BigAttr *n;
  char *free;
  int i;
  size_t size;
  int nmemb_local;
  char *dtype_local;
  char *attrname_local;
  BigAttrSet *attrset_local;
  
  iVar1 = big_file_dtype_itemsize(dtype);
  sVar2 = strlen(attrname);
  uVar3 = (long)(iVar1 * nmemb) + sVar2 + 1;
  while (attrset->bufsize - attrset->bufused < uVar3) {
    for (free._4_4_ = 0; (ulong)(long)free._4_4_ < attrset->listused; free._4_4_ = free._4_4_ + 1) {
      attrset->attrlist[free._4_4_].data =
           attrset->attrlist[free._4_4_].data + -(long)attrset->attrbuf;
      attrset->attrlist[free._4_4_].name =
           attrset->attrlist[free._4_4_].name + -(long)attrset->attrbuf;
    }
    pcVar4 = (char *)realloc(attrset->attrbuf,attrset->bufsize << 1);
    attrset->attrbuf = pcVar4;
    attrset->bufsize = attrset->bufsize << 1;
    for (free._4_4_ = 0; (ulong)(long)free._4_4_ < attrset->listused; free._4_4_ = free._4_4_ + 1) {
      attrset->attrlist[free._4_4_].data =
           attrset->attrbuf + (long)attrset->attrlist[free._4_4_].data;
      attrset->attrlist[free._4_4_].name =
           attrset->attrbuf + (long)attrset->attrlist[free._4_4_].name;
    }
  }
  pcVar4 = attrset->attrbuf + attrset->bufused;
  attrset->bufused = uVar3 + attrset->bufused;
  pBVar5 = attrset_append_attr(attrset);
  pBVar5->nmemb = nmemb;
  memset(pBVar5->dtype,0,8);
  _dtype_normalize(pBVar5->dtype,dtype);
  pBVar5->name = pcVar4;
  strcpy(pcVar4,attrname);
  sVar2 = strlen(attrname);
  pBVar5->data = pcVar4 + sVar2 + 1;
  qsort(attrset->attrlist,attrset->listused,0x20,attr_cmp);
  return 0;
}

Assistant:

static int
attrset_add_attr(BigAttrSet * attrset, const char * attrname, const char * dtype, int nmemb)
{
    size_t size = big_file_dtype_itemsize(dtype) * nmemb + strlen(attrname) + 1;
    while(attrset->bufsize - attrset->bufused < size) {
        int i;
        for(i = 0; i < attrset->listused; i ++) {
            attrset->attrlist[i].data -= (ptrdiff_t) attrset->attrbuf;
            attrset->attrlist[i].name -= (ptrdiff_t) attrset->attrbuf;
        }
        attrset->attrbuf = realloc(attrset->attrbuf, attrset->bufsize * 2);
        attrset->bufsize *= 2;
        for(i = 0; i < attrset->listused; i ++) {
            attrset->attrlist[i].data += (ptrdiff_t) attrset->attrbuf;
            attrset->attrlist[i].name += (ptrdiff_t) attrset->attrbuf;
        }
    }
    char * free = attrset->attrbuf + attrset->bufused;
    attrset->bufused += size;

    BigAttr * n = attrset_append_attr(attrset);

    n->nmemb = nmemb;
    memset(n->dtype, 0, 8);
    _dtype_normalize(n->dtype, dtype);

    n->name = free;
    strcpy(free, attrname);
    free += strlen(attrname) + 1;
    n->data = free;

    qsort(attrset->attrlist, attrset->listused, sizeof(BigAttr), attr_cmp);
    return 0;
}